

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Response.cpp
# Opt level: O1

object get_status(SRUP_MSG_RESPONSE *self)

{
  uint8_t *puVar1;
  PyObject *pPVar2;
  SRUP_MSG_RESPONSE *in_RSI;
  
  puVar1 = SRUP_MSG_RESPONSE::status(in_RSI);
  if (puVar1 == (uint8_t *)0x0) {
    pPVar2 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    pPVar2 = boost::python::api::object_initializer_impl<false,_false>::get<unsigned_char>(puVar1);
  }
  (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)pPVar2;
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_status(SRUP_MSG_RESPONSE& self)
{
        const uint8_t* rv;
        rv = self.status();

        if (rv != nullptr)
            return boost::python::object(*rv);
        else
            return boost::python::object();
}